

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# barray.c
# Opt level: O2

void bit_array_clear_range(void *array,size_t bit,size_t count)

{
  byte *pbVar1;
  ulong uVar2;
  byte bVar3;
  size_t i;
  ulong uVar4;
  
  if ((count != 0 && array != (void *)0x0) && (uVar2 = *array, bit < uVar2)) {
    uVar4 = count + bit;
    if (uVar2 < count + bit) {
      uVar4 = uVar2;
    }
    for (; bit < uVar4; bit = bit + 1) {
      bVar3 = (byte)bit & 7;
      pbVar1 = (byte *)((long)array + (bit >> 3) + 8);
      *pbVar1 = *pbVar1 & (-2 << bVar3 | 0xfeU >> 8 - bVar3);
    }
  }
  return;
}

Assistant:

void bit_array_clear_range(void * array, size_t bit, size_t count)
{
    if (array && count)
    {
        size_t * size = (size_t *) array;
        if (bit < *size)
        {
            unsigned char * ptr = (unsigned char *)(size + 1);
            size_t i;
            for (i = bit; i < *size && i < bit + count; ++i)
                ptr[i >> 3] &= ~(1U << (i & 7));
        }
    }
}